

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char>::visit_char
          (BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char> *this,int value)

{
  uint total_size;
  FormatSpec *pFVar1;
  char cVar2;
  wchar_t value_00;
  uint uVar3;
  FormatError *this_00;
  CharPtr pcStack_50;
  uint char_width;
  CharPtr out;
  char fill;
  CStringRef local_38;
  WidthSpec local_30;
  undefined8 local_28;
  undefined8 local_20;
  wchar_t local_14;
  BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char> *pBStack_10;
  int value_local;
  BasicArgFormatter<fmt::internal::ArgFormatter<char>,_char> *this_local;
  
  local_14 = value;
  pBStack_10 = this;
  if ((this->spec_->type_ == '\0') || (this->spec_->type_ == 'c')) {
    if (((this->spec_->super_AlignSpec).align_ == ALIGN_NUMERIC) || (this->spec_->flags_ != 0)) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      BasicCStringRef<char>::BasicCStringRef(&local_38,"invalid format specifier for char");
      FormatError::FormatError(this_00,local_38);
      __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
    }
    value_00 = WidthSpec::fill((WidthSpec *)this->spec_);
    out._3_1_ = BasicCharTraits<char>::cast(value_00);
    if ((this->spec_->super_AlignSpec).super_WidthSpec.width_ < 2) {
      pcStack_50 = BasicWriter<char>::grow_buffer(this->writer_,1);
    }
    else {
      pcStack_50 = BasicWriter<char>::grow_buffer
                             (this->writer_,
                              (ulong)(this->spec_->super_AlignSpec).super_WidthSpec.width_);
      if ((this->spec_->super_AlignSpec).align_ == ALIGN_RIGHT) {
        std::fill_n<char*,unsigned_int,char>
                  (pcStack_50,(this->spec_->super_AlignSpec).super_WidthSpec.width_ - 1,
                   (char *)((long)&out + 3));
        pcStack_50 = pcStack_50 + ((this->spec_->super_AlignSpec).super_WidthSpec.width_ - 1);
      }
      else if ((this->spec_->super_AlignSpec).align_ == ALIGN_CENTER) {
        total_size = (this->spec_->super_AlignSpec).super_WidthSpec.width_;
        uVar3 = check<unsigned_int>(1);
        pcStack_50 = BasicWriter<char>::fill_padding
                               (pcStack_50,total_size,(ulong)uVar3,(int)out._3_1_);
      }
      else {
        std::fill_n<char*,unsigned_int,char>
                  (pcStack_50 + 1,(this->spec_->super_AlignSpec).super_WidthSpec.width_ - 1,
                   (char *)((long)&out + 3));
      }
    }
    cVar2 = BasicCharTraits<char>::cast(local_14);
    *pcStack_50 = cVar2;
  }
  else {
    this->spec_->flags_ = this->spec_->flags_ | 0x10;
    pFVar1 = this->spec_;
    local_30 = (pFVar1->super_AlignSpec).super_WidthSpec;
    local_28 = *(undefined8 *)&(pFVar1->super_AlignSpec).align_;
    local_20._0_4_ = pFVar1->precision_;
    local_20._4_1_ = pFVar1->type_;
    local_20._5_3_ = *(undefined3 *)&pFVar1->field_0x15;
    BasicWriter<char>::write_int<int,fmt::FormatSpec>(this->writer_,value,*pFVar1);
  }
  return;
}

Assistant:

void visit_char(int value) {
    if (spec_.type_ && spec_.type_ != 'c') {
      spec_.flags_ |= CHAR_FLAG;
      writer_.write_int(value, spec_);
      return;
    }
    if (spec_.align_ == ALIGN_NUMERIC || spec_.flags_ != 0)
      FMT_THROW(FormatError("invalid format specifier for char"));
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    Char fill = internal::CharTraits<Char>::cast(spec_.fill());
    CharPtr out = CharPtr();
    const unsigned char_width = 1;
    if (spec_.width_ > char_width) {
      out = writer_.grow_buffer(spec_.width_);
      if (spec_.align_ == ALIGN_RIGHT) {
        std::fill_n(out, spec_.width_ - char_width, fill);
        out += spec_.width_ - char_width;
      } else if (spec_.align_ == ALIGN_CENTER) {
        out = writer_.fill_padding(out, spec_.width_,
                                   internal::check(char_width), fill);
      } else {
        std::fill_n(out + char_width, spec_.width_ - char_width, fill);
      }
    } else {
      out = writer_.grow_buffer(char_width);
    }
    *out = internal::CharTraits<Char>::cast(value);
  }